

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O1

void do_bank(int *ip)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  char *stptr;
  long lVar5;
  char name [128];
  char acStack_a8 [136];
  
  if (proc_ptr != (t_proc *)0x0) {
    fatal_error("Bank can not be changed in procs!");
    return;
  }
  labldef(loccnt,1);
  iVar2 = evaluate(ip,'\0');
  if (iVar2 == 0) {
    return;
  }
  if ((int)value <= bank_limit) {
    cVar1 = prlnbuf[*ip];
    if ((cVar1 != '\0') && (cVar1 != ';')) {
      if (cVar1 != ',') {
        stptr = "Syntax error!";
        goto LAB_0010a82b;
      }
      *ip = *ip + 1;
      iVar2 = getstring(ip,acStack_a8,0x3f);
      if (iVar2 == 0) {
        return;
      }
      uVar3 = (ulong)value;
      if ((bank_name[uVar3][0] != '\0') &&
         (iVar2 = strcasecmp(bank_name[uVar3],acStack_a8), iVar2 != 0)) {
        error("Different bank names not allowed!");
        return;
      }
      strcpy(bank_name[uVar3],acStack_a8);
      iVar2 = check_eol(ip);
      if (iVar2 == 0) {
        return;
      }
    }
    lVar4 = (long)section;
    lVar5 = (long)bank;
    bank_glabl[lVar4][lVar5] = glablptr;
    bank_loccnt[lVar4][lVar5] = loccnt;
    bank_page[lVar4][lVar5] = page;
    lVar5 = (long)(int)value;
    bank = value;
    page = bank_page[lVar4][lVar5];
    loccnt = bank_loccnt[lVar4][lVar5];
    glablptr = bank_glabl[lVar4][lVar5];
    if (max_bank < (int)value) {
      max_bank = value;
    }
    if (pass == 1) {
      loadlc(value,1);
      println();
    }
    return;
  }
  stptr = "Bank index out of range!";
LAB_0010a82b:
  error(stptr);
  return;
}

Assistant:

void
do_bank(int *ip)
{
	char name[128];

	/* not allowed in procs */
	if (proc_ptr) {
		fatal_error("Bank can not be changed in procs!");
		return;
	}

	/* define label */
	labldef(loccnt, 1);

	/* get bank index */
	if (!evaluate(ip, 0))
		return;
	if ((int)value > bank_limit) {
		error("Bank index out of range!");
		return;
	}

	/* check if there's a bank name */
	switch (prlnbuf[*ip]) {
	case ';':
	case '\0':
		break;

	case ',':
		/* get name */
		(*ip)++;
		if (!getstring(ip, name, 63))
			return;

		/* check name validity */
		if (strlen(bank_name[value])) {
			if (strcasecmp(bank_name[value], name)) {
				error("Different bank names not allowed!");
				return;
			}
		}

		/* copy name */
		strcpy(bank_name[value], name);

		/* check end of line */
		if (!check_eol(ip))
			return;

		/* ok */
		break;

	default:
		error("Syntax error!");
		return;
	}

	/* backup current bank infos */
	bank_glabl[section][bank]  = glablptr;
	bank_loccnt[section][bank] = loccnt;
	bank_page[section][bank]   = page;

	/* get new bank infos */
	bank     = value;
	page     = bank_page[section][bank];
	loccnt   = bank_loccnt[section][bank];
	glablptr = bank_glabl[section][bank];

	/* update the max bank counter */
	if (max_bank < bank)
		max_bank = bank;

	/* output on last pass */
	if (pass == LAST_PASS) {
		loadlc(bank, 1);
		println();
	}
}